

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

void __thiscall mkvmuxer::Chapter::Clear(Chapter *this)

{
  int iVar1;
  Display *d;
  Chapter *this_local;
  
  anon_unknown_12::StrCpy((char *)0x0,&this->id_);
  while (0 < this->displays_count_) {
    iVar1 = this->displays_count_ + -1;
    this->displays_count_ = iVar1;
    Display::Clear(this->displays_ + iVar1);
  }
  if (this->displays_ != (Display *)0x0) {
    operator_delete__(this->displays_);
  }
  this->displays_ = (Display *)0x0;
  this->displays_size_ = 0;
  return;
}

Assistant:

void Chapter::Clear() {
  StrCpy(NULL, &id_);

  while (displays_count_ > 0) {
    Display& d = displays_[--displays_count_];
    d.Clear();
  }

  delete[] displays_;
  displays_ = NULL;

  displays_size_ = 0;
}